

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O2

int Io_MvParseLiteralMv(Io_MvMod_t *p,Abc_Obj_t *pNode,char *pToken,Vec_Str_t *vFunc,int iLit)

{
  char cVar1;
  Io_MvMan_t *pIVar2;
  Abc_Obj_t *pObj;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  uint *puVar7;
  char *pcVar8;
  int *piVar9;
  size_t __n;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char Buffer [10];
  
  if (*pToken == '=') {
    for (uVar10 = 0; iVar4 = (pNode->vFanins).nSize, (long)uVar10 < (long)iVar4; uVar10 = uVar10 + 1
        ) {
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar10]])
      ;
      iVar4 = strcmp(pcVar6,pToken + 1);
      if (iVar4 == 0) {
        iVar4 = (pNode->vFanins).nSize;
        break;
      }
    }
    if (iVar4 == (int)uVar10) {
      pIVar2 = p->pMan;
      uVar5 = Io_MvGetLine(pIVar2,pToken);
      sprintf(pIVar2->sError,
              "Line %d: Node name in the table \"%s\" cannot be found on .names line.",(ulong)uVar5,
              pToken + 1);
      return 0;
    }
    Vec_StrPush(vFunc,'=');
    pToken = Buffer;
    sprintf(pToken,"%d",uVar10 & 0xffffffff);
  }
  else {
    if ((pNode->vFanins).nSize <= iLit) {
      __assert_fail("iLit < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x694,
                    "int Io_MvParseLiteralMv(Io_MvMod_t *, Abc_Obj_t *, char *, Vec_Str_t *, int)");
    }
    if (iLit < 0) {
      piVar9 = (pNode->vFanouts).pArray;
    }
    else {
      piVar9 = (pNode->vFanins).pArray + (uint)iLit;
    }
    pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar9];
    puVar7 = (uint *)Abc_ObjMvVar(pObj);
    if ((puVar7 != (uint *)0x0) && (pcVar6 = pToken, *(long *)(puVar7 + 2) != 0)) {
      while (cVar1 = *pcVar6, cVar1 != '\0') {
        iVar4 = Io_MvCharIsMvSymb(cVar1);
        if (iVar4 == 0) {
          sVar3 = 1;
          pcVar8 = pcVar6;
          do {
            pcVar12 = pcVar8;
            __n = sVar3;
            if (pcVar12[1] == '\0') break;
            iVar4 = Io_MvCharIsMvSymb(pcVar12[1]);
            sVar3 = __n + 1;
            pcVar8 = pcVar12 + 1;
          } while (iVar4 == 0);
          uVar5 = *puVar7;
          uVar10 = 0;
          if (0 < (int)uVar5) {
            uVar10 = (ulong)uVar5;
          }
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            iVar4 = strncmp(*(char **)(*(long *)(puVar7 + 2) + uVar11 * 8),pcVar6,__n);
            if (iVar4 == 0) {
              uVar10 = uVar11 & 0xffffffff;
              break;
            }
          }
          if ((uint)uVar10 == uVar5) {
            pcVar12[1] = '\0';
            pIVar2 = p->pMan;
            uVar5 = Io_MvGetLine(pIVar2,pToken);
            pcVar8 = Abc_ObjName(pObj);
            sprintf(pIVar2->sError,
                    "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\"."
                    ,(ulong)uVar5,pcVar6,pcVar8);
            return 0;
          }
          sprintf(Buffer,"%d",uVar10);
          Vec_StrPrintStr(vFunc,Buffer);
        }
        else {
          Vec_StrPush(vFunc,cVar1);
          pcVar12 = pcVar6;
        }
        pcVar6 = pcVar12 + 1;
      }
      goto LAB_0029947c;
    }
  }
  Vec_StrPrintStr(vFunc,pToken);
LAB_0029947c:
  cVar1 = ' ';
  if (iLit == -1) {
    cVar1 = '\n';
  }
  Vec_StrPush(vFunc,cVar1);
  return 1;
}

Assistant:

static int Io_MvParseLiteralMv( Io_MvMod_t * p, Abc_Obj_t * pNode, char * pToken, Vec_Str_t * vFunc, int iLit )
{
    char Buffer[10];
    Io_MvVar_t * pVar;
    Abc_Obj_t * pFanin, * pNet;
    char * pCur, * pNext;
    int i;
    // consider the equality literal
    if ( pToken[0] == '=' )
    {
        // find the fanins
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( !strcmp( Abc_ObjName(pFanin), pToken + 1 ) )
                break;
        if ( i == Abc_ObjFaninNum(pNode) )
        {
            sprintf( p->pMan->sError, "Line %d: Node name in the table \"%s\" cannot be found on .names line.", 
                Io_MvGetLine(p->pMan, pToken), pToken + 1 );
            return 0;
        }
        Vec_StrPush( vFunc, '=' );
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // consider regular literal
    assert( iLit < Abc_ObjFaninNum(pNode) );
    pNet = iLit >= 0 ? Abc_ObjFanin(pNode, iLit) : Abc_ObjFanout0(pNode);
    pVar = (Io_MvVar_t *)Abc_ObjMvVar( pNet );
    // if the var is absent or has no symbolic values quit
    if ( pVar == NULL || pVar->pNames == NULL )
    {
        Vec_StrPrintStr( vFunc, pToken );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // parse the literal using symbolic values
    for ( pCur = pToken; *pCur; pCur++ )
    {
        if ( Io_MvCharIsMvSymb(*pCur) )
        {
            Vec_StrPush( vFunc, *pCur );
            continue;
        }
        // find the next MvSymb char
        for ( pNext = pCur+1; *pNext; pNext++ )
            if ( Io_MvCharIsMvSymb(*pNext) )
                break;
        // look for the value name
        for ( i = 0; i < pVar->nValues; i++ )
            if ( !strncmp( pVar->pNames[i], pCur, pNext-pCur ) )
                break;
        if ( i == pVar->nValues )
        {
            *pNext = 0;
            sprintf( p->pMan->sError, "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\".", 
                Io_MvGetLine(p->pMan, pToken), pCur, Abc_ObjName(pNet) );
            return 0;
        }
        // value name is found
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        // update the pointer
        pCur = pNext - 1;
    }
    Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
    return 1;
}